

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_interface_variables_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::RemoveUnusedInterfaceVariablesPass::Process(RemoveUnusedInterfaceVariablesPass *this)

{
  bool bVar1;
  bool bVar2;
  Status SVar3;
  undefined1 local_c8 [8];
  RemoveUnusedInterfaceVariablesContext context;
  Instruction *entry;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  bool modified;
  RemoveUnusedInterfaceVariablesPass *this_local;
  
  bVar1 = false;
  Pass::get_module(&this->super_Pass);
  Module::entry_points((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry);
  while (bVar2 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&entry), bVar2)
  {
    context.pfn_._M_invoker =
         (_Invoker_type)
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    RemoveUnusedInterfaceVariablesContext::RemoveUnusedInterfaceVariablesContext
              ((RemoveUnusedInterfaceVariablesContext *)local_c8,this,
               (Instruction *)context.pfn_._M_invoker);
    RemoveUnusedInterfaceVariablesContext::CollectUsedVariables
              ((RemoveUnusedInterfaceVariablesContext *)local_c8);
    bVar2 = RemoveUnusedInterfaceVariablesContext::ShouldModify
                      ((RemoveUnusedInterfaceVariablesContext *)local_c8);
    if (bVar2) {
      RemoveUnusedInterfaceVariablesContext::Modify
                ((RemoveUnusedInterfaceVariablesContext *)local_c8);
      bVar1 = true;
    }
    RemoveUnusedInterfaceVariablesContext::~RemoveUnusedInterfaceVariablesContext
              ((RemoveUnusedInterfaceVariablesContext *)local_c8);
    InstructionList::iterator::operator++(&__end2);
  }
  SVar3 = SuccessWithoutChange;
  if (bVar1) {
    SVar3 = SuccessWithChange;
  }
  return SVar3;
}

Assistant:

RemoveUnusedInterfaceVariablesPass::Status
RemoveUnusedInterfaceVariablesPass::Process() {
  bool modified = false;
  for (auto& entry : get_module()->entry_points()) {
    RemoveUnusedInterfaceVariablesContext context(*this, entry);
    context.CollectUsedVariables();
    if (context.ShouldModify()) {
      context.Modify();
      modified = true;
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}